

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.h
# Opt level: O0

_Bool run_container_remove(run_container_t *run,uint16_t pos)

{
  int iVar1;
  int32_t iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint16_t in_SI;
  int32_t *in_RDI;
  int32_t newlength;
  uint16_t newvalue;
  int32_t le_1;
  int32_t offset;
  int32_t le;
  int32_t index;
  uint16_t in_stack_ffffffffffffffce;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  iVar2 = interleavedBinarySearch(*(rle16_t **)(in_RDI + 2),*in_RDI,in_SI);
  if (-1 < iVar2) {
    if (*(short *)(*(long *)(in_RDI + 2) + 2 + (long)iVar2 * 4) == 0) {
      recoverRoomAtIndex((run_container_t *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffce);
    }
    else {
      *(short *)(*(long *)(in_RDI + 2) + (long)iVar2 * 4) =
           *(short *)(*(long *)(in_RDI + 2) + (long)iVar2 * 4) + 1;
      *(short *)(*(long *)(in_RDI + 2) + 2 + (long)iVar2 * 4) =
           *(short *)(*(long *)(in_RDI + 2) + 2 + (long)iVar2 * 4) + -1;
    }
    return true;
  }
  iVar1 = -iVar2;
  iVar3 = iVar1 + -2;
  if (-1 < iVar3) {
    uVar4 = (uint)in_SI - (uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)iVar3 * 4);
    uVar5 = (uint)*(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)iVar3 * 4);
    if ((int)uVar4 < (int)uVar5) {
      *(short *)(*(long *)(in_RDI + 2) + 2 + (long)iVar3 * 4) = (short)uVar4 + -1;
      iVar3 = (uVar5 - uVar4) + -1;
      makeRoomAtIndex((run_container_t *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffce);
      *(uint16_t *)(*(long *)(in_RDI + 2) + (long)(iVar1 + -1) * 4) = in_SI + 1;
      *(short *)(*(long *)(in_RDI + 2) + 2 + (long)(iVar1 + -1) * 4) = (short)iVar3;
      return true;
    }
    if (uVar4 == uVar5) {
      *(short *)(*(long *)(in_RDI + 2) + 2 + (long)iVar3 * 4) =
           *(short *)(*(long *)(in_RDI + 2) + 2 + (long)iVar3 * 4) + -1;
      return true;
    }
  }
  return false;
}

Assistant:

static inline bool run_container_remove(run_container_t *run, uint16_t pos) {
    int32_t index = interleavedBinarySearch(run->runs, run->n_runs, pos);
    if (index >= 0) {
        int32_t le = run->runs[index].length;
        if (le == 0) {
            recoverRoomAtIndex(run, (uint16_t)index);
        } else {
            run->runs[index].value++;
            run->runs[index].length--;
        }
        return true;
    }
    index = -index - 2;  // points to preceding value, possibly -1
    if (index >= 0) {    // possible match
        int32_t offset = pos - run->runs[index].value;
        int32_t le = run->runs[index].length;
        if (offset < le) {
            // need to break in two
            run->runs[index].length = (uint16_t)(offset - 1);
            // need to insert
            uint16_t newvalue = pos + 1;
            int32_t newlength = le - offset - 1;
            makeRoomAtIndex(run, (uint16_t)(index + 1));
            run->runs[index + 1].value = newvalue;
            run->runs[index + 1].length = (uint16_t)newlength;
            return true;

        } else if (offset == le) {
            run->runs[index].length--;
            return true;
        }
    }
    // no match
    return false;
}